

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ubjson_encoder.hpp
# Opt level: O1

bool __thiscall
jsoncons::ubjson::
basic_ubjson_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<char>_>
::visit_begin_array(basic_ubjson_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<char>_>
                    *this,size_t length,semantic_tag param_2,ser_context *param_3,error_code *ec)

{
  int iVar1;
  uchar local_22 [2];
  size_t local_20;
  ubjson_container_type local_14;
  
  iVar1 = this->nesting_depth_;
  this->nesting_depth_ = iVar1 + 1;
  local_20 = length;
  if (iVar1 < *(int *)((this->options_)._vptr_ubjson_encode_options[-3] + 8 +
                      (long)&(this->options_)._vptr_ubjson_encode_options)) {
    local_14 = array;
    std::
    vector<jsoncons::ubjson::basic_ubjson_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,std::allocator<char>>::stack_item,std::allocator<jsoncons::ubjson::basic_ubjson_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,std::allocator<char>>::stack_item>>
    ::emplace_back<jsoncons::ubjson::ubjson_container_type,unsigned_long&>
              ((vector<jsoncons::ubjson::basic_ubjson_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,std::allocator<char>>::stack_item,std::allocator<jsoncons::ubjson::basic_ubjson_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,std::allocator<char>>::stack_item>>
                *)&this->stack_,&local_14,&local_20);
    local_22[0] = '[';
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              ((this->sink_).buf_ptr,local_22);
    local_22[1] = 0x23;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              ((this->sink_).buf_ptr,local_22 + 1);
    put_length(this,local_20);
  }
  else {
    std::error_code::operator=(ec,max_nesting_depth_exceeded);
  }
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_begin_array(std::size_t length, semantic_tag, const ser_context&, std::error_code& ec) override
    {
        if (JSONCONS_UNLIKELY(++nesting_depth_ > options_.max_nesting_depth()))
        {
            ec = ubjson_errc::max_nesting_depth_exceeded;
            JSONCONS_VISITOR_RETURN;
        } 
        stack_.emplace_back(ubjson_container_type::array, length);
        sink_.push_back(jsoncons::ubjson::ubjson_type::start_array_marker);
        sink_.push_back(jsoncons::ubjson::ubjson_type::count_marker);
        put_length(length);

        JSONCONS_VISITOR_RETURN;
    }